

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_AddInitBias(void)

{
  Abc_Ntk_t *pNtk_00;
  uint uVar1;
  int iVar2;
  long *plVar3;
  Abc_Obj_t *pBiasNode_00;
  Abc_Obj_t *pObj_00;
  Flow_Data_t *local_40;
  int nConstraints;
  int id;
  int j;
  int i;
  InitConstraint_t *pConstraint;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pBiasNode;
  Abc_Ntk_t *pNtk;
  
  pNtk_00 = pManMR->pNtk;
  uVar1 = Vec_PtrSize(pManMR->vInitConstraints);
  if (pManMR->pDataArray == (Flow_Data_t *)0x0) {
    local_40 = (Flow_Data_t *)
               malloc((long)(int)(pManMR->nNodes + uVar1 * (pManMR->iteration + 1)) * 0x18);
  }
  else {
    local_40 = (Flow_Data_t *)
               realloc(pManMR->pDataArray,
                       (long)(int)(pManMR->nNodes + uVar1 * (pManMR->iteration + 1)) * 0x18);
  }
  pManMR->pDataArray = local_40;
  memset(pManMR->pDataArray + pManMR->nNodes,0,(long)(int)(uVar1 * (pManMR->iteration + 1)) * 0x18);
  if (pManMR->fVerbose != 0) {
    printf("\t\tcreating %d bias structures\n",(ulong)uVar1);
  }
  for (id = 0; iVar2 = Vec_PtrSize(pManMR->vInitConstraints), id < iVar2; id = id + 1) {
    plVar3 = (long *)Vec_PtrEntry(pManMR->vInitConstraints,id);
    if (*plVar3 == 0) {
      pBiasNode_00 = Abc_NtkCreateBlackbox(pNtk_00);
      for (nConstraints = 0; iVar2 = Vec_IntSize((Vec_Int_t *)(plVar3 + 1)), nConstraints < iVar2;
          nConstraints = nConstraints + 1) {
        iVar2 = Vec_IntEntry((Vec_Int_t *)(plVar3 + 1),nConstraints);
        pObj_00 = Abc_NtkObj(pNtk_00,iVar2);
        iVar2 = Vec_IntEntry((Vec_Int_t *)(plVar3 + 3),nConstraints);
        Abc_FlowRetime_ConnectBiasNode(pBiasNode_00,pObj_00,iVar2);
      }
    }
  }
  return;
}

Assistant:

void Abc_FlowRetime_AddInitBias( ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Obj_t *pBiasNode, *pObj;
  InitConstraint_t *pConstraint;
  int i, j, id;
  const int nConstraints = Vec_PtrSize( pManMR->vInitConstraints );

  pManMR->pDataArray = ABC_REALLOC( Flow_Data_t, pManMR->pDataArray, pManMR->nNodes + (nConstraints*(pManMR->iteration+1)) );
  memset(pManMR->pDataArray + pManMR->nNodes, 0, sizeof(Flow_Data_t)*(nConstraints*(pManMR->iteration+1)));

  vprintf("\t\tcreating %d bias structures\n", nConstraints);

  Vec_PtrForEachEntry(InitConstraint_t*, pManMR->vInitConstraints, pConstraint, i ) {
    if (pConstraint->pBiasNode) continue;
    
 //   printf("\t\t\tbias %d...\n", i);
    pBiasNode = Abc_NtkCreateBlackbox( pNtk );

    Vec_IntForEachEntry( &pConstraint->vNodes, id, j ) {
      pObj = Abc_NtkObj(pNtk, id);
      Abc_FlowRetime_ConnectBiasNode(pBiasNode, pObj, Vec_IntEntry(&pConstraint->vLags, j));
    }

    // pConstraint->pBiasNode = pBiasNode;
  }
}